

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_analyze.cpp
# Opt level: O1

SharedExNdPtr __thiscall front::syntax::SyntaxAnalyze::gm_l_val(SyntaxAnalyze *this,ValueMode mode)

{
  irGenerator *piVar1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<front::optimization::bmir_variable_table::VarSingle>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<front::optimization::bmir_variable_table::VarSingle>_>_>_>
  *this_00;
  char cVar2;
  NodeType NVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  pointer pWVar6;
  undefined8 *puVar7;
  long lVar8;
  long lVar9;
  pointer pcVar10;
  element_type *peVar11;
  string name_00;
  string name_01;
  string name_02;
  string name_03;
  string name_04;
  string name_05;
  string name_06;
  string name_07;
  string name_08;
  string name_09;
  string name_10;
  undefined8 uVar12;
  bool bVar13;
  int iVar14;
  ExpressNode *pEVar15;
  ulong uVar16;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar17;
  _Alloc_hider _Var18;
  const_iterator cVar19;
  mapped_type *pmVar20;
  const_iterator cVar21;
  mapped_type *pmVar22;
  undefined8 uVar23;
  undefined4 uVar24;
  int in_EDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_06;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_07;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_08;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var25;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_09;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_11;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_12;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_13;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_14;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_15;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_16;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_17;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_18;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_19;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_20;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_21;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_22;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_23;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_24;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_25;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_26;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_27;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_28;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_29;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_30;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_31;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_32;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_33;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_34;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_35;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_36;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_37;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_38;
  byte bVar26;
  undefined4 in_register_00000034;
  SyntaxAnalyze *this_01;
  _Variadic_union<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var27;
  SharedExNdPtr SVar28;
  SharedSyPtr var;
  string valueTmp;
  string value;
  SharedSyPtr arr;
  string name;
  pointer in_stack_fffffffffffff9b8;
  pointer psVar29;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_fffffffffffff9c0;
  _Alloc_hider in_stack_fffffffffffff9c8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_fffffffffffff9d0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var30;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_628;
  undefined1 local_618 [44];
  int local_5ec;
  ExpressNode *local_5e8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_5e0 [2];
  __node_base local_5d0;
  undefined1 local_5c8 [16];
  undefined1 local_5b8 [32];
  Displayable local_598;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_590 [2];
  _Base_ptr local_580;
  element_type *local_578;
  undefined1 local_570 [24];
  _Base_ptr local_558;
  SharedExNdPtr local_550;
  SharedExNdPtr local_540;
  long local_530;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_528;
  SharedExNdPtr local_520;
  SharedExNdPtr local_510;
  long *local_500 [2];
  long local_4f0 [2];
  _Alloc_hider local_4e0 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4d0;
  _Alloc_hider local_4c0 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4b0;
  _Alloc_hider local_4a0 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_490;
  _Alloc_hider local_480 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_470;
  string local_460;
  _Alloc_hider local_440 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_430;
  _Alloc_hider local_420 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_410;
  _Alloc_hider local_400 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3f0;
  _Alloc_hider local_3e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3d0;
  pointer *local_3c0 [2];
  pointer local_3b0 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_3a0 [2];
  undefined1 local_390 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_380;
  _Base_ptr local_370 [2];
  string local_360;
  string local_340;
  string local_320;
  string local_300;
  undefined1 local_2e0 [32];
  string local_2c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2a0 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_290;
  string local_280;
  undefined1 local_260 [32];
  byte local_240;
  _Variadic_union<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_238;
  byte local_218;
  undefined1 local_210 [32];
  byte local_1f0;
  _Variadic_union<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1e8;
  byte local_1c8;
  _Variadic_union<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1c0;
  byte local_1a0;
  _Variadic_union<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_198;
  byte local_178;
  _Variadic_union<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_170;
  byte local_150;
  undefined1 local_148 [32];
  __index_type local_128;
  _Variadic_union<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_120;
  undefined1 local_100;
  undefined1 local_f8 [32];
  __index_type local_d8;
  _Variadic_union<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d0;
  undefined1 local_b0;
  _Variadic_union<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a8;
  byte local_88;
  _Variadic_union<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_80;
  byte local_60;
  _Variadic_union<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  byte local_38;
  
  this_01 = (SyntaxAnalyze *)CONCAT44(in_register_00000034,mode);
  local_5ec = in_EDX;
  pEVar15 = (ExpressNode *)operator_new(0x48);
  express::ExpressNode::ExpressNode(pEVar15);
  *(ExpressNode **)this = pEVar15;
  local_5b8._24_8_ = &this->matched_index;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<front::express::ExpressNode*>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_5b8._24_8_,pEVar15);
  local_580 = (_Base_ptr)local_570;
  local_578 = (element_type *)0x0;
  local_570[0] = _S_red;
  match_one_word(this_01,IDENFR);
  word::Word::get_self_abi_cxx11_
            ((string *)local_618,
             (this_01->word_list->
             super__Vector_base<front::word::Word,_std::allocator<front::word::Word>_>)._M_impl.
             super__Vector_impl_data._M_start + this_01->matched_index);
  std::__cxx11::string::operator=((string *)&local_580,(string *)local_618);
  paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(local_618 + 0x10);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_618._0_8_ != paVar17) {
    operator_delete((void *)local_618._0_8_,CONCAT71(local_618._17_7_,local_618[0x10]) + 1);
  }
  uVar16 = this_01->matched_index + 1;
  pWVar6 = (this_01->word_list->
           super__Vector_base<front::word::Word,_std::allocator<front::word::Word>_>)._M_impl.
           super__Vector_impl_data._M_start;
  local_5d0._M_nxt = (_Hash_node_base *)this;
  if (((ulong)(((long)(this_01->word_list->
                      super__Vector_base<front::word::Word,_std::allocator<front::word::Word>_>).
                      _M_impl.super__Vector_impl_data._M_finish - (long)pWVar6 >> 4) *
              -0x5555555555555555) <= uVar16) ||
     (bVar13 = word::Word::match_token(pWVar6 + uVar16,LBRACK), !bVar13)) {
    local_3e0._M_p = (pointer)&local_3d0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_3e0,local_580,
               (undefined1 *)((long)&local_578->_vptr_Symbol + (long)local_580));
    symbolTable::SymbolTable::find_least_layer_symbol
              ((SymbolTable *)&stack0xfffffffffffff9b8,(string *)&this_01->symbolTable);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3e0._M_p != &local_3d0) {
      operator_delete(local_3e0._M_p,local_3d0._M_allocated_capacity + 1);
    }
    iVar14 = (*(code *)((in_stack_fffffffffffff9b8->
                        super___shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>).
                       _M_ptr)->_vptr_Symbol)();
    if (iVar14 == 0) {
      if ((_Base_ptr)in_stack_fffffffffffff9c0._M_pi != (_Base_ptr)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (in_stack_fffffffffffff9c0._M_pi)->_M_use_count =
               (in_stack_fffffffffffff9c0._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (in_stack_fffffffffffff9c0._M_pi)->_M_use_count =
               (in_stack_fffffffffffff9c0._M_pi)->_M_use_count + 1;
        }
      }
      cVar2 = *(char *)&in_stack_fffffffffffff9b8[3].
                        super___shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      ;
      _Var25._M_pi = extraout_RDX;
      if ((_Base_ptr)in_stack_fffffffffffff9c0._M_pi != (_Base_ptr)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (in_stack_fffffffffffff9c0._M_pi);
        _Var25._M_pi = extraout_RDX_01;
      }
      if (cVar2 != '\0') {
        **(undefined8 **)this = 0x200000000;
        if ((_Base_ptr)in_stack_fffffffffffff9c0._M_pi == (_Base_ptr)0x0) {
          *(undefined4 *)(*(long *)this + 8) =
               *(undefined4 *)
                ((long)&in_stack_fffffffffffff9b8[3].
                        super___shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                + 4);
        }
        else {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (in_stack_fffffffffffff9c0._M_pi)->_M_use_count =
                 (in_stack_fffffffffffff9c0._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (in_stack_fffffffffffff9c0._M_pi)->_M_use_count =
                 (in_stack_fffffffffffff9c0._M_pi)->_M_use_count + 1;
          }
          *(undefined4 *)(*(long *)this + 8) =
               *(undefined4 *)
                ((long)&in_stack_fffffffffffff9b8[3].
                        super___shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                + 4);
          if ((_Base_ptr)in_stack_fffffffffffff9c0._M_pi != (_Base_ptr)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (in_stack_fffffffffffff9c0._M_pi);
            _Var25._M_pi = extraout_RDX_05;
          }
        }
        goto LAB_001a834c;
      }
      **(undefined8 **)this = 0x200000001;
      p_Var27 = (in_stack_fffffffffffff9b8->
                super___shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
                _M_pi;
      local_400[0]._M_p = (pointer)&local_3f0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_400,p_Var27,
                 (long)&p_Var27->_vptr__Sp_counted_base +
                 (long)in_stack_fffffffffffff9b8[1].
                       super___shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
      ;
      piVar1 = &this_01->irGenerator;
      name_00._M_string_length = (size_type)in_stack_fffffffffffff9c0._M_pi;
      name_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffff9b8;
      name_00.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffff9c8._M_p;
      name_00.field_2._8_8_ = in_stack_fffffffffffff9d0._M_pi;
      irGenerator::irGenerator::getVarName((string *)local_618,piVar1,name_00,(uint32_t)local_400);
      std::__cxx11::string::operator=((string *)(*(long *)this + 0x10),(string *)local_618);
      _Var25._M_pi = extraout_RDX_02;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_618._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(local_618 + 0x10)) {
        operator_delete((void *)local_618._0_8_,CONCAT71(local_618._17_7_,local_618[0x10]) + 1);
        _Var25._M_pi = extraout_RDX_03;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_400[0]._M_p != &local_3f0) {
        operator_delete(local_400[0]._M_p,local_3f0._M_allocated_capacity + 1);
        _Var25._M_pi = extraout_RDX_04;
      }
      if (*(uint32_t *)
           &in_stack_fffffffffffff9b8[2].
            super___shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          == this_01->_initLayerNum) {
        local_5e8 = (ExpressNode *)0x0;
        a_Stack_5e0[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_618._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_618[0x10] = '\0';
        local_618._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(local_618 + 0x10);
        irGenerator::irGenerator::getNewTmpValueName_abi_cxx11_
                  ((string *)&stack0xfffffffffffff9c8,piVar1,Ptr);
        std::__cxx11::string::operator=((string *)local_618,(string *)&stack0xfffffffffffff9c8);
        _Var25._M_pi = in_stack_fffffffffffff9d0._M_pi;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)in_stack_fffffffffffff9c8._M_p != &local_628) {
          operator_delete(in_stack_fffffffffffff9c8._M_p,
                          CONCAT71(local_628._M_allocated_capacity._1_7_,local_628._M_local_buf[0])
                          + 1);
          _Var25._M_pi = in_stack_fffffffffffff9d0._M_pi;
        }
        _Var18._M_p = (pointer)operator_new(0x48);
        express::ExpressNode::ExpressNode((ExpressNode *)_Var18._M_p);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<front::express::ExpressNode*>
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xfffffffffffff9d0,
                   (ExpressNode *)_Var18._M_p);
        in_stack_fffffffffffff9c8._M_p = (pointer)0x0;
        in_stack_fffffffffffff9d0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_5e8 = (ExpressNode *)_Var18._M_p;
        if (a_Stack_5e0[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_5e0[0]._M_pi);
          a_Stack_5e0[0]._M_pi = _Var25._M_pi;
          _Var25._M_pi = a_Stack_5e0[0]._M_pi;
        }
        a_Stack_5e0[0]._M_pi = _Var25._M_pi;
        if (in_stack_fffffffffffff9d0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)
        {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (in_stack_fffffffffffff9d0._M_pi);
        }
        local_5e8->_type = VAR;
        local_5e8->_operation = PTR;
        std::__cxx11::string::_M_assign((string *)&local_5e8->_name);
        local_550.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr
             = *(element_type **)this;
        local_550.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this->matched_index;
        if ((_Base_ptr)
            local_550.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Base_ptr)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(int *)&((_Base_ptr)
                     local_550.
                     super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi)->_M_parent =
                 *(int *)&((_Base_ptr)
                          local_550.
                          super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount._M_pi)->_M_parent + 1;
            UNLOCK();
          }
          else {
            *(int *)&((_Base_ptr)
                     local_550.
                     super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi)->_M_parent =
                 *(int *)&((_Base_ptr)
                          local_550.
                          super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount._M_pi)->_M_parent + 1;
          }
        }
        express::ExpressNode::addChild(local_5e8,&local_550);
        if ((_Base_ptr)
            local_550.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Base_ptr)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_550.
                     super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        local_198._0_8_ = (long)&local_198 + 0x10;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_198,local_618._0_8_,
                   (pointer)((long)(_func_int ***)local_618._8_8_ + local_618._0_8_));
        local_178 = 1;
        local_80._0_8_ = (long)&local_80 + 0x10;
        lVar8 = *(long *)(*(long *)this + 0x10);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_80,lVar8,*(long *)(*(long *)this + 0x18) + lVar8);
        local_60 = 1;
        irGenerator::irGenerator::ir_ref
                  (piVar1,(LeftVal *)&local_198._M_first,(LeftVal *)&local_80._M_first,false);
        (*std::__detail::__variant::
          __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
          ::_S_vtable._M_arr[local_60]._M_data)
                  ((anon_class_1_0_00000001 *)&stack0xfffffffffffff9c8,
                   (variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_80._M_first);
        local_60 = 0xff;
        (*std::__detail::__variant::
          __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
          ::_S_vtable._M_arr[local_178]._M_data)
                  ((anon_class_1_0_00000001 *)&stack0xfffffffffffff9c8,
                   (variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_198._M_first);
        this = (SyntaxAnalyze *)local_5d0._M_nxt;
        local_178 = 0xff;
        if (local_5ec == 1) {
          (local_5d0._M_nxt)->_M_nxt = (_Hash_node_base *)local_5e8;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_5b8._24_8_,a_Stack_5e0);
          _Var25._M_pi = extraout_RDX_18;
        }
        else {
          local_598._vptr_Displayable = (_func_int **)0x0;
          a_Stack_590[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          in_stack_fffffffffffff9d0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_628._M_local_buf[0] = '\0';
          in_stack_fffffffffffff9c8._M_p = (pointer)&local_628;
          irGenerator::irGenerator::getNewTmpValueName_abi_cxx11_((string *)local_5c8,piVar1,Int);
          std::__cxx11::string::operator=((string *)&stack0xfffffffffffff9c8,(string *)local_5c8);
          if ((element_type *)local_5c8._0_8_ != (element_type *)(local_5c8 + 0x10)) {
            operator_delete((void *)local_5c8._0_8_,(ulong)(local_5b8._0_8_ + 1));
          }
          pEVar15 = (ExpressNode *)operator_new(0x48);
          express::ExpressNode::ExpressNode(pEVar15);
          local_5c8._0_8_ = pEVar15;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
          __shared_count<front::express::ExpressNode*>
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_5c8 + 8),pEVar15);
          _Var25._M_pi = a_Stack_590[0]._M_pi;
          a_Stack_590[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_5c8._8_8_;
          local_598._vptr_Displayable = (_func_int **)local_5c8._0_8_;
          local_5c8._0_8_ = (element_type *)0x0;
          local_5c8._8_8_ = (_Base_ptr)0x0;
          if (_Var25._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var25._M_pi);
          }
          if ((_Base_ptr)local_5c8._8_8_ != (_Base_ptr)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_5c8._8_8_);
          }
          *local_598._vptr_Displayable = (_func_int *)0x1800000001;
          std::__cxx11::string::_M_assign((string *)(local_598._vptr_Displayable + 2));
          local_570._16_8_ = local_5e8;
          local_558 = (_Base_ptr)a_Stack_5e0[0]._M_pi;
          if ((_Base_ptr)a_Stack_5e0[0]._M_pi != (_Base_ptr)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (a_Stack_5e0[0]._M_pi)->_M_use_count = (a_Stack_5e0[0]._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (a_Stack_5e0[0]._M_pi)->_M_use_count = (a_Stack_5e0[0]._M_pi)->_M_use_count + 1;
            }
          }
          express::ExpressNode::addChild
                    ((ExpressNode *)local_598._vptr_Displayable,(SharedExNdPtr *)(local_570 + 0x10))
          ;
          if (local_558 != (_Base_ptr)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_558);
          }
          local_1c0._0_8_ = (long)&local_1c0 + 0x10;
          pcVar10 = (((string *)(local_598._vptr_Displayable + 2))->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_1c0,pcVar10,pcVar10 + (long)local_598._vptr_Displayable[3]);
          local_1a0 = 1;
          local_a8._0_8_ = (long)&local_a8 + 0x10;
          pcVar10 = (local_5e8->_name)._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_a8,pcVar10,pcVar10 + (local_5e8->_name)._M_string_length);
          local_88 = 2;
          irGenerator::irGenerator::ir_load
                    (piVar1,(LeftVal *)&local_1c0._M_first,(RightVal *)&local_a8._M_first);
          (*std::__detail::__variant::
            __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
            ::_S_vtable._M_arr[local_88]._M_data)
                    ((anon_class_1_0_00000001 *)local_5c8,
                     (variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_a8._M_first);
          local_88 = 0xff;
          (*std::__detail::__variant::
            __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
            ::_S_vtable._M_arr[local_1a0]._M_data)
                    ((anon_class_1_0_00000001 *)local_5c8,
                     (variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_1c0._M_first);
          this = (SyntaxAnalyze *)local_5d0._M_nxt;
          local_1a0 = 0xff;
          (local_5d0._M_nxt)->_M_nxt = (_Hash_node_base *)local_598._vptr_Displayable;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_5b8._24_8_,
                     (__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_5b8 + 0x28));
          _Var25._M_pi = extraout_RDX_19;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)in_stack_fffffffffffff9c8._M_p != &local_628) {
            operator_delete(in_stack_fffffffffffff9c8._M_p,
                            CONCAT71(local_628._M_allocated_capacity._1_7_,local_628._M_local_buf[0]
                                    ) + 1);
            _Var25._M_pi = extraout_RDX_20;
          }
          if ((_Base_ptr)a_Stack_590[0]._M_pi != (_Base_ptr)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_590[0]._M_pi);
            _Var25._M_pi = extraout_RDX_21;
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_618._0_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(local_618 + 0x10)) {
          operator_delete((void *)local_618._0_8_,CONCAT71(local_618._17_7_,local_618[0x10]) + 1);
          _Var25._M_pi = extraout_RDX_22;
        }
        if ((_Base_ptr)a_Stack_5e0[0]._M_pi != (_Base_ptr)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_5e0[0]._M_pi);
          _Var25._M_pi = extraout_RDX_23;
        }
      }
      if (local_5ec != 1) goto LAB_001a834c;
      p_Var27 = (in_stack_fffffffffffff9b8->
                super___shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
                _M_pi;
      local_420[0]._M_p = (pointer)&local_410;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_420,p_Var27,
                 (long)&p_Var27->_vptr__Sp_counted_base +
                 (long)in_stack_fffffffffffff9b8[1].
                       super___shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
      ;
      name_05._M_string_length = (size_type)in_stack_fffffffffffff9c0._M_pi;
      name_05._M_dataplus._M_p = (pointer)in_stack_fffffffffffff9b8;
      name_05.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffff9c8._M_p;
      name_05.field_2._8_8_ = in_stack_fffffffffffff9d0._M_pi;
      irGenerator::irGenerator::getVarName(&local_300,piVar1,name_05,(uint32_t)local_420);
      this_00 = &(this_01->bmirVariableTable).name2VarSingle;
      cVar21 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<front::optimization::bmir_variable_table::VarSingle>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<front::optimization::bmir_variable_table::VarSingle>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<front::optimization::bmir_variable_table::VarSingle>_>_>_>
               ::find(&this_00->_M_t,&local_300);
      _Var25._M_pi = extraout_RDX_24;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_300._M_dataplus._M_p != &local_300.field_2) {
        operator_delete(local_300._M_dataplus._M_p,local_300.field_2._M_allocated_capacity + 1);
        _Var25._M_pi = extraout_RDX_25;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_420[0]._M_p != &local_410) {
        operator_delete(local_420[0]._M_p,local_410._M_allocated_capacity + 1);
        _Var25._M_pi = extraout_RDX_26;
      }
      if ((_Rb_tree_header *)cVar21._M_node ==
          &(this_01->bmirVariableTable).name2VarSingle._M_t._M_impl.super__Rb_tree_header)
      goto LAB_001a834c;
      p_Var27 = (in_stack_fffffffffffff9b8->
                super___shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
                _M_pi;
      local_440[0]._M_p = (pointer)&local_430;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_440,p_Var27,
                 (long)&p_Var27->_vptr__Sp_counted_base +
                 (long)in_stack_fffffffffffff9b8[1].
                       super___shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
      ;
      name_06._M_string_length = (size_type)in_stack_fffffffffffff9c0._M_pi;
      name_06._M_dataplus._M_p = (pointer)in_stack_fffffffffffff9b8;
      name_06.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffff9c8._M_p;
      name_06.field_2._8_8_ = in_stack_fffffffffffff9d0._M_pi;
      irGenerator::irGenerator::getVarName(&local_320,piVar1,name_06,(uint32_t)local_440);
      pmVar22 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<front::optimization::bmir_variable_table::VarSingle>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<front::optimization::bmir_variable_table::VarSingle>_>_>_>
                ::at(this_00,&local_320);
      ((pmVar22->
       super___shared_ptr<front::optimization::bmir_variable_table::VarSingle,_(__gnu_cxx::_Lock_policy)2>
       )._M_ptr)->changed = true;
      _Var25._M_pi = extraout_RDX_27;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_320._M_dataplus._M_p != &local_320.field_2) {
        operator_delete(local_320._M_dataplus._M_p,
                        (ulong)(local_320.field_2._M_allocated_capacity + 1));
        _Var25._M_pi = extraout_RDX_28;
      }
      _Var18._M_p = local_440[0]._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_440[0]._M_p == &local_430) goto LAB_001a834c;
    }
    else {
      iVar14 = (*(code *)((in_stack_fffffffffffff9b8->
                          super___shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>).
                         _M_ptr)->_vptr_Symbol)();
      _Var25._M_pi = extraout_RDX_00;
      if (iVar14 != 2) goto LAB_001a834c;
      local_618._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_618[0x10] = '\0';
      piVar1 = &this_01->irGenerator;
      local_618._0_8_ = paVar17;
      irGenerator::irGenerator::getNewTmpValueName_abi_cxx11_
                ((string *)&stack0xfffffffffffff9c8,piVar1,Ptr);
      std::__cxx11::string::operator=((string *)local_618,(string *)&stack0xfffffffffffff9c8);
      _Var25._M_pi = in_stack_fffffffffffff9c0._M_pi;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)in_stack_fffffffffffff9c8._M_p != &local_628) {
        operator_delete(in_stack_fffffffffffff9c8._M_p,
                        CONCAT71(local_628._M_allocated_capacity._1_7_,local_628._M_local_buf[0]) +
                        1);
        _Var25._M_pi = in_stack_fffffffffffff9c0._M_pi;
      }
      puVar7 = *(undefined8 **)this;
      *puVar7 = 0x600000001;
      std::__cxx11::string::_M_assign((string *)(puVar7 + 2));
      if ((_Base_ptr)_Var25._M_pi != (_Base_ptr)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (_Var25._M_pi)->_M_use_count = (_Var25._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (_Var25._M_pi)->_M_use_count = (_Var25._M_pi)->_M_use_count + 1;
        }
      }
      cVar2 = *(char *)&in_stack_fffffffffffff9b8[4].
                        super___shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      ;
      if ((_Base_ptr)_Var25._M_pi != (_Base_ptr)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var25._M_pi);
      }
      _Var18._M_p = (pointer)&local_628;
      if (cVar2 == '\0') {
        if ((_Base_ptr)_Var25._M_pi != (_Base_ptr)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (_Var25._M_pi)->_M_use_count = (_Var25._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (_Var25._M_pi)->_M_use_count = (_Var25._M_pi)->_M_use_count + 1;
          }
        }
        cVar2 = *(char *)((long)&in_stack_fffffffffffff9b8[4].
                                 super___shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr + 1);
        in_stack_fffffffffffff9c0._M_pi = _Var25._M_pi;
        if ((_Base_ptr)_Var25._M_pi != (_Base_ptr)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var25._M_pi);
        }
        if (cVar2 == '\0') {
          uVar4 = *(uint32_t *)
                   &in_stack_fffffffffffff9b8[2].
                    super___shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
          uVar5 = this_01->_initLayerNum;
          if (uVar4 == uVar5) {
            bVar26 = 0;
          }
          else {
            if ((_Base_ptr)in_stack_fffffffffffff9c0._M_pi != (_Base_ptr)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                (in_stack_fffffffffffff9c0._M_pi)->_M_use_count =
                     (in_stack_fffffffffffff9c0._M_pi)->_M_use_count + 1;
                UNLOCK();
              }
              else {
                (in_stack_fffffffffffff9c0._M_pi)->_M_use_count =
                     (in_stack_fffffffffffff9c0._M_pi)->_M_use_count + 1;
              }
            }
            bVar26 = *(byte *)&in_stack_fffffffffffff9b8[4].
                               super___shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr ^ 1;
            _Var25._M_pi = in_stack_fffffffffffff9c0._M_pi;
          }
          if ((_Base_ptr)_Var25._M_pi != (_Base_ptr)0x0 && uVar4 != uVar5) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var25._M_pi);
          }
          if (bVar26 == 0) {
            local_120._0_8_ = (long)&local_120 + 0x10;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_120,local_618._0_8_,
                       (pointer)((long)(_func_int ***)local_618._8_8_ + local_618._0_8_));
            this = (SyntaxAnalyze *)local_5d0._M_nxt;
            local_100 = 1;
            p_Var27 = (in_stack_fffffffffffff9b8->
                      super___shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>).
                      _M_refcount._M_pi;
            local_4c0[0]._M_p = (pointer)&local_4b0;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_4c0,p_Var27,
                       (long)&p_Var27->_vptr__Sp_counted_base +
                       (long)in_stack_fffffffffffff9b8[1].
                             super___shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr);
            name_08._M_string_length = (size_type)in_stack_fffffffffffff9c0._M_pi;
            name_08._M_dataplus._M_p = (pointer)in_stack_fffffffffffff9b8;
            name_08.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffff9c8._M_p;
            name_08.field_2._8_8_ = in_stack_fffffffffffff9d0._M_pi;
            irGenerator::irGenerator::getVarName
                      ((string *)&stack0xfffffffffffff9c8,piVar1,name_08,(uint32_t)local_4c0);
            local_148._0_8_ = in_stack_fffffffffffff9c8._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)in_stack_fffffffffffff9c8._M_p == &local_628) {
              local_148._24_8_ = local_628._8_8_;
              local_148._0_8_ =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(local_148 + 0x10);
            }
            _Var30._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            local_628._M_local_buf[0] = '\0';
            local_128 = '\x01';
            irGenerator::irGenerator::ir_ref
                      (piVar1,(LeftVal *)&local_120._M_first,(LeftVal *)local_148,false);
            std::__detail::__variant::
            _Variant_storage<false,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~_Variant_storage((_Variant_storage<false,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)local_148);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_Var18._M_p != &local_628) {
              operator_delete(_Var18._M_p,
                              CONCAT71(local_628._M_allocated_capacity._1_7_,
                                       local_628._M_local_buf[0]) + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4c0[0]._M_p != &local_4b0) {
              operator_delete(local_4c0[0]._M_p,local_4b0._M_allocated_capacity + 1);
            }
            this_02 = &local_120;
          }
          else {
            local_d0._0_8_ = (long)&local_d0 + 0x10;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_d0,local_618._0_8_,
                       (pointer)((long)(_func_int ***)local_618._8_8_ + local_618._0_8_));
            this = (SyntaxAnalyze *)local_5d0._M_nxt;
            local_b0 = 1;
            p_Var27 = (in_stack_fffffffffffff9b8->
                      super___shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>).
                      _M_refcount._M_pi;
            local_4a0[0]._M_p = (pointer)&local_490;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_4a0,p_Var27,
                       (long)&p_Var27->_vptr__Sp_counted_base +
                       (long)in_stack_fffffffffffff9b8[1].
                             super___shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr);
            name_07._M_string_length = (size_type)in_stack_fffffffffffff9c0._M_pi;
            name_07._M_dataplus._M_p = (pointer)in_stack_fffffffffffff9b8;
            name_07.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffff9c8._M_p;
            name_07.field_2._8_8_ = in_stack_fffffffffffff9d0._M_pi;
            irGenerator::irGenerator::getVarName
                      ((string *)&stack0xfffffffffffff9c8,piVar1,name_07,(uint32_t)local_4a0);
            local_f8._0_8_ = in_stack_fffffffffffff9c8._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)in_stack_fffffffffffff9c8._M_p == &local_628) {
              local_f8._24_8_ = local_628._8_8_;
              local_f8._0_8_ =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(local_f8 + 0x10);
            }
            _Var30._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            local_628._M_local_buf[0] = '\0';
            local_d8 = '\x02';
            irGenerator::irGenerator::ir_assign
                      (piVar1,(LeftVal *)&local_d0._M_first,(RightVal *)local_f8);
            std::__detail::__variant::
            _Variant_storage<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~_Variant_storage((_Variant_storage<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)local_f8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_Var18._M_p != &local_628) {
              operator_delete(_Var18._M_p,
                              CONCAT71(local_628._M_allocated_capacity._1_7_,
                                       local_628._M_local_buf[0]) + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4a0[0]._M_p != &local_490) {
              operator_delete(local_4a0[0]._M_p,local_490._M_allocated_capacity + 1);
            }
            this_02 = &local_d0;
          }
          std::__detail::__variant::
          _Variant_storage<false,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~_Variant_storage((_Variant_storage<false,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)&this_02->_M_first);
        }
        else {
          local_238._0_8_ = (long)&local_238 + 0x10;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_238,local_618._0_8_,
                     (pointer)((long)(_func_int ***)local_618._8_8_ + local_618._0_8_));
          this = (SyntaxAnalyze *)local_5d0._M_nxt;
          local_218 = 1;
          p_Var27 = (in_stack_fffffffffffff9b8->
                    super___shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>).
                    _M_refcount._M_pi;
          local_480[0]._M_p = (pointer)&local_470;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_480,p_Var27,
                     (long)&p_Var27->_vptr__Sp_counted_base +
                     (long)in_stack_fffffffffffff9b8[1].
                           super___shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr);
          name_02._M_string_length = (size_type)in_stack_fffffffffffff9c0._M_pi;
          name_02._M_dataplus._M_p = (pointer)in_stack_fffffffffffff9b8;
          name_02.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffff9c8._M_p;
          name_02.field_2._8_8_ = in_stack_fffffffffffff9d0._M_pi;
          irGenerator::irGenerator::getVarName
                    ((string *)&stack0xfffffffffffff9c8,piVar1,name_02,(uint32_t)local_480);
          local_260._0_8_ = in_stack_fffffffffffff9c8._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)in_stack_fffffffffffff9c8._M_p == &local_628) {
            local_260._24_8_ = local_628._8_8_;
            local_260._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(local_260 + 0x10);
          }
          _Var30._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_628._M_local_buf[0] = '\0';
          local_240 = 2;
          irGenerator::irGenerator::ir_assign
                    (piVar1,(LeftVal *)&local_238._M_first,(RightVal *)local_260);
          (*std::__detail::__variant::
            __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
            ::_S_vtable._M_arr[local_240]._M_data)
                    ((anon_class_1_0_00000001 *)local_5c8,
                     (variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_260);
          local_240 = 0xff;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var18._M_p != &local_628) {
            operator_delete(_Var18._M_p,
                            CONCAT71(local_628._M_allocated_capacity._1_7_,local_628._M_local_buf[0]
                                    ) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_480[0]._M_p != &local_470) {
            operator_delete(local_480[0]._M_p,local_470._M_allocated_capacity + 1);
          }
          (*std::__detail::__variant::
            __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
            ::_S_vtable._M_arr[local_218]._M_data)
                    ((anon_class_1_0_00000001 *)&stack0xfffffffffffff9c8,
                     (variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_238._M_first);
          local_218 = 0xff;
        }
      }
      else {
        local_1e8._0_8_ = (long)&local_1e8 + 0x10;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1e8,local_618._0_8_,
                   (pointer)((long)(_func_int ***)local_618._8_8_ + local_618._0_8_));
        this = (SyntaxAnalyze *)local_5d0._M_nxt;
        local_1c8 = 1;
        p_Var27 = (in_stack_fffffffffffff9b8->
                  super___shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>)._M_refcount
                  ._M_pi;
        local_460._M_dataplus._M_p = (pointer)&local_460.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_460,p_Var27,
                   (long)&p_Var27->_vptr__Sp_counted_base +
                   (long)in_stack_fffffffffffff9b8[1].
                         super___shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr);
        irGenerator::irGenerator::getConstName
                  ((string *)&stack0xfffffffffffff9c8,piVar1,&local_460,
                   *(int *)((long)&in_stack_fffffffffffff9b8[2].
                                   super___shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_refcount._M_pi + 4));
        local_210._0_8_ = in_stack_fffffffffffff9c8._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)in_stack_fffffffffffff9c8._M_p == &local_628) {
          local_210._24_8_ = local_628._8_8_;
          local_210._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(local_210 + 0x10);
        }
        _Var30._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_628._M_local_buf[0] = '\0';
        local_1f0 = 1;
        irGenerator::irGenerator::ir_ref
                  (piVar1,(LeftVal *)&local_1e8._M_first,(LeftVal *)local_210,false);
        (*std::__detail::__variant::
          __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
          ::_S_vtable._M_arr[local_1f0]._M_data)
                  ((anon_class_1_0_00000001 *)local_5c8,
                   (variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_210);
        local_1f0 = 0xff;
        in_stack_fffffffffffff9c0._M_pi = _Var25._M_pi;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var18._M_p != &local_628) {
          operator_delete(_Var18._M_p,
                          CONCAT71(local_628._M_allocated_capacity._1_7_,local_628._M_local_buf[0])
                          + 1);
          in_stack_fffffffffffff9c0._M_pi = _Var25._M_pi;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_460._M_dataplus._M_p != &local_460.field_2) {
          operator_delete(local_460._M_dataplus._M_p,local_460.field_2._M_allocated_capacity + 1);
        }
        (*std::__detail::__variant::
          __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
          ::_S_vtable._M_arr[local_1c8]._M_data)
                  ((anon_class_1_0_00000001 *)&stack0xfffffffffffff9c8,
                   (variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_1e8._M_first);
        local_1c8 = 0xff;
      }
      p_Var27 = (in_stack_fffffffffffff9b8->
                super___shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
                _M_pi;
      local_4e0[0]._M_p = (pointer)&local_4d0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_4e0,p_Var27,
                 (long)&p_Var27->_vptr__Sp_counted_base +
                 (long)in_stack_fffffffffffff9b8[1].
                       super___shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
      ;
      name_09._M_string_length = (size_type)in_stack_fffffffffffff9c0._M_pi;
      name_09._M_dataplus._M_p = (pointer)in_stack_fffffffffffff9b8;
      name_09.field_2._M_allocated_capacity = (size_type)_Var18._M_p;
      name_09.field_2._8_8_ = _Var30._M_pi;
      irGenerator::irGenerator::getVarName(&local_340,piVar1,name_09,(uint32_t)local_4e0);
      cVar19 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<front::optimization::bmir_variable_table::VarArray>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<front::optimization::bmir_variable_table::VarArray>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<front::optimization::bmir_variable_table::VarArray>_>_>_>
               ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<front::optimization::bmir_variable_table::VarArray>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<front::optimization::bmir_variable_table::VarArray>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<front::optimization::bmir_variable_table::VarArray>_>_>_>
                       *)&this_01->bmirVariableTable,&local_340);
      _Var25._M_pi = extraout_RDX_29;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_340._M_dataplus._M_p != &local_340.field_2) {
        operator_delete(local_340._M_dataplus._M_p,local_340.field_2._M_allocated_capacity + 1);
        _Var25._M_pi = extraout_RDX_30;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4e0[0]._M_p != &local_4d0) {
        operator_delete(local_4e0[0]._M_p,local_4d0._M_allocated_capacity + 1);
        _Var25._M_pi = extraout_RDX_31;
      }
      if ((_Rb_tree_header *)cVar19._M_node !=
          &(this_01->bmirVariableTable).name2VarArray._M_t._M_impl.super__Rb_tree_header) {
        p_Var27 = (in_stack_fffffffffffff9b8->
                  super___shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>)._M_refcount
                  ._M_pi;
        local_500[0] = local_4f0;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_500,p_Var27,
                   (long)&p_Var27->_vptr__Sp_counted_base +
                   (long)in_stack_fffffffffffff9b8[1].
                         super___shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr);
        name_10._M_string_length = (size_type)in_stack_fffffffffffff9c0._M_pi;
        name_10._M_dataplus._M_p = (pointer)in_stack_fffffffffffff9b8;
        name_10.field_2._M_allocated_capacity = (size_type)_Var18._M_p;
        name_10.field_2._8_8_ = _Var30._M_pi;
        irGenerator::irGenerator::getVarName(&local_360,piVar1,name_10,(uint32_t)local_500);
        pmVar20 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<front::optimization::bmir_variable_table::VarArray>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<front::optimization::bmir_variable_table::VarArray>_>_>_>
                  ::at(&(this_01->bmirVariableTable).name2VarArray,&local_360);
        ((pmVar20->
         super___shared_ptr<front::optimization::bmir_variable_table::VarArray,_(__gnu_cxx::_Lock_policy)2>
         )._M_ptr)->changed = true;
        _Var25._M_pi = extraout_RDX_32;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_360._M_dataplus._M_p != &local_360.field_2) {
          operator_delete(local_360._M_dataplus._M_p,local_360.field_2._M_allocated_capacity + 1);
          _Var25._M_pi = extraout_RDX_33;
        }
        if (local_500[0] != local_4f0) {
          operator_delete(local_500[0],local_4f0[0] + 1);
          _Var25._M_pi = extraout_RDX_34;
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_618._0_8_ ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(local_618 + 0x10)) goto LAB_001a834c;
      local_430._M_allocated_capacity = CONCAT71(local_618._17_7_,local_618[0x10]);
      _Var18._M_p = (pointer)local_618._0_8_;
    }
    operator_delete(_Var18._M_p,local_430._M_allocated_capacity + 1);
    _Var25._M_pi = extraout_RDX_35;
    goto LAB_001a834c;
  }
  local_380._M_allocated_capacity = (size_type)local_370;
  std::__cxx11::string::_M_construct<char*>
            ((string *)
             &((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_390)->
              field_2,local_580,(undefined1 *)((long)&local_578->_vptr_Symbol + (long)local_580));
  symbolTable::SymbolTable::find_least_layer_symbol
            ((SymbolTable *)local_5c8,(string *)&this_01->symbolTable);
  if ((_Base_ptr *)local_380._M_allocated_capacity != local_370) {
    operator_delete((void *)local_380._M_allocated_capacity,
                    (ulong)((long)&local_370[0]->_M_color + 1));
  }
  uVar12 = local_5c8._8_8_;
  psVar29 = (pointer)0x0;
  _Var25._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  **(undefined4 **)this = 1;
  if ((_Base_ptr)local_5c8._8_8_ != (_Base_ptr)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)(local_5c8._8_8_ + 8) = *(int *)(local_5c8._8_8_ + 8) + 1;
      UNLOCK();
    }
    else {
      *(int *)(local_5c8._8_8_ + 8) = *(int *)(local_5c8._8_8_ + 8) + 1;
    }
  }
  uVar24 = 6;
  if ((*(byte *)(local_5c8._0_8_ + 0x41) == 0) &&
     (uVar24 = 3,
     *(uint32_t *)&((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_5c8._0_8_ + 0x28))->_M_pi
     != this_01->_initLayerNum)) {
    if ((_Base_ptr)local_5c8._8_8_ == (_Base_ptr)0x0) {
      *(uint *)(*(long *)this + 4) =
           (*(byte *)&((__shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2> *)
                      &((_Base_ptr)(local_5c8._0_8_ + 0x40))->_M_color)->_M_ptr ^ 1) * 3 + 3;
    }
    else {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)(local_5c8._8_8_ + 8) = *(int *)(local_5c8._8_8_ + 8) + 1;
        UNLOCK();
      }
      else {
        *(int *)(local_5c8._8_8_ + 8) = *(int *)(local_5c8._8_8_ + 8) + 1;
      }
      *(uint *)(*(long *)this + 4) =
           (*(byte *)&((__shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2> *)
                      &((_Base_ptr)(local_5c8._0_8_ + 0x40))->_M_color)->_M_ptr ^ 1) * 3 + 3;
      if ((_Base_ptr)local_5c8._8_8_ != (_Base_ptr)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_5c8._8_8_);
      }
    }
  }
  else {
    *(undefined4 *)(*(long *)this + 4) = uVar24;
  }
  if ((_Base_ptr)uVar12 != (_Base_ptr)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar12);
  }
  uVar12 = local_5c8._8_8_;
  if ((_Base_ptr)local_5c8._8_8_ != (_Base_ptr)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)(local_5c8._8_8_ + 8) = *(int *)(local_5c8._8_8_ + 8) + 1;
      UNLOCK();
    }
    else {
      *(int *)(local_5c8._8_8_ + 8) = *(int *)(local_5c8._8_8_ + 8) + 1;
    }
  }
  cVar2 = *(char *)&((__shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2> *)
                    &((_Base_ptr)(local_5c8._0_8_ + 0x40))->_M_color)->_M_ptr;
  if (cVar2 == '\x01') {
    local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_280,
               ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_5c8._0_8_ + 8))->_M_pi,
               (long)&((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_5c8._0_8_ + 8))->_M_pi->
                      _vptr__Sp_counted_base +
               (long)((__shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2> *)
                     &((string *)(local_5c8._0_8_ + 0x10))->_M_dataplus)->_M_ptr);
    irGenerator::irGenerator::getConstName
              ((string *)local_618,&this_01->irGenerator,&local_280,*(int *)(local_5c8._0_8_ + 0x2c)
              );
  }
  else {
    local_2a0[0] = &local_290;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_2a0,
               ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_5c8._0_8_ + 8))->_M_pi,
               (long)&((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_5c8._0_8_ + 8))->_M_pi->
                      _vptr__Sp_counted_base +
               (long)((__shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2> *)
                     &((string *)(local_5c8._0_8_ + 0x10))->_M_dataplus)->_M_ptr);
    name_01._M_string_length = (size_type)_Var25._M_pi;
    name_01._M_dataplus._M_p = (pointer)psVar29;
    name_01.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffff9c8._M_p;
    name_01.field_2._8_8_ = in_stack_fffffffffffff9d0._M_pi;
    irGenerator::irGenerator::getVarName
              ((string *)local_618,&this_01->irGenerator,name_01,(uint32_t)local_2a0);
  }
  std::__cxx11::string::operator=((string *)(*(long *)this + 0x10),(string *)local_618);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_618._0_8_ != paVar17) {
    operator_delete((void *)local_618._0_8_,CONCAT71(local_618._17_7_,local_618[0x10]) + 1);
  }
  if (cVar2 == '\0') {
    paVar17 = &local_290;
  }
  else {
    paVar17 = &local_280.field_2;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)(&paVar17->_M_allocated_capacity)[-2] != paVar17) {
    operator_delete((long *)(&paVar17->_M_allocated_capacity)[-2],paVar17->_M_allocated_capacity + 1
                   );
  }
  if ((_Base_ptr)uVar12 != (_Base_ptr)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar12);
  }
  p_Var27 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  while( true ) {
    uVar16 = this_01->matched_index + 1;
    pWVar6 = (this_01->word_list->
             super__Vector_base<front::word::Word,_std::allocator<front::word::Word>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if (((ulong)(((long)(this_01->word_list->
                        super__Vector_base<front::word::Word,_std::allocator<front::word::Word>_>).
                        _M_impl.super__Vector_impl_data._M_finish - (long)pWVar6 >> 4) *
                -0x5555555555555555) <= uVar16) ||
       (bVar13 = word::Word::match_token(pWVar6 + uVar16,LBRACK), !bVar13)) break;
    match_one_word(this_01,LBRACK);
    gm_exp((SyntaxAnalyze *)local_618);
    uVar23 = local_618._8_8_;
    uVar12 = local_618._0_8_;
    local_618._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x0;
    local_618._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if (p_Var27 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var27);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_618._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_618._8_8_);
    }
    pEVar15 = (ExpressNode *)(local_5d0._M_nxt)->_M_nxt;
    local_510.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)uVar12;
    local_510.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar23;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar23 !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(_Atomic_word *)(uVar23 + 8) = *(_Atomic_word *)(uVar23 + 8) + 1;
        UNLOCK();
      }
      else {
        *(_Atomic_word *)(uVar23 + 8) = *(_Atomic_word *)(uVar23 + 8) + 1;
      }
    }
    express::ExpressNode::addChild(pEVar15,&local_510);
    this = (SyntaxAnalyze *)local_5d0._M_nxt;
    if (local_510.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_510.
                 super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    match_one_word(this_01,RBRACK);
    p_Var27 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar23;
  }
  local_520.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_5c8._0_8_;
  local_520.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_5c8._8_8_;
  if ((_Base_ptr)local_5c8._8_8_ != (_Base_ptr)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)(local_5c8._8_8_ + 8) = *(int *)(local_5c8._8_8_ + 8) + 1;
      UNLOCK();
    }
    else {
      *(int *)(local_5c8._8_8_ + 8) = *(int *)(local_5c8._8_8_ + 8) + 1;
    }
  }
  local_530 = *(long *)this;
  local_528 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this->matched_index;
  if (local_528 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_528->_M_use_count = local_528->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_528->_M_use_count = local_528->_M_use_count + 1;
    }
  }
  computeIndex((SyntaxAnalyze *)local_618,(SharedSyPtr *)this_01,&local_520);
  _Var30._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_618._8_8_;
  paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_618._0_8_;
  local_618._0_8_ =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)0x0;
  local_618._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (_Var25._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var25._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_618._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_618._8_8_);
  }
  if (local_528 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_528);
  }
  _Var25._M_pi = local_520.
                 super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
  if ((_Base_ptr)
      local_520.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Base_ptr)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_520.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_5ec == 1) {
    bVar13 = true;
  }
  else {
    lVar8 = *(long *)(*(long *)this + 0x38);
    lVar9 = *(long *)(*(long *)this + 0x30);
    if ((_Base_ptr)local_5c8._8_8_ != (_Base_ptr)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)(local_5c8._8_8_ + 8) = *(int *)(local_5c8._8_8_ + 8) + 1;
        UNLOCK();
      }
      else {
        *(int *)(local_5c8._8_8_ + 8) = *(int *)(local_5c8._8_8_ + 8) + 1;
      }
    }
    bVar13 = (ulong)(lVar8 - lVar9) <
             (ulong)((long)*(_Base_ptr *)(local_5c8._0_8_ + 0x50) -
                    (long)*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                           &((element_type *)(local_5c8._0_8_ + 0x48))->_type);
    _Var25._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_5c8._8_8_;
  }
  if ((_Base_ptr)_Var25._M_pi != (_Base_ptr)0x0 && local_5ec != 1) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var25._M_pi);
  }
  if (bVar13) {
    *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      **)this = paVar17;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_5b8._24_8_,
               (__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xfffffffffffff9c0);
    _Var25._M_pi = extraout_RDX_06;
  }
  else {
    if ((_Base_ptr)local_5c8._8_8_ != (_Base_ptr)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)(local_5c8._8_8_ + 8) = *(int *)(local_5c8._8_8_ + 8) + 1;
        UNLOCK();
      }
      else {
        *(int *)(local_5c8._8_8_ + 8) = *(int *)(local_5c8._8_8_ + 8) + 1;
      }
    }
    _Var25._M_pi = in_stack_fffffffffffff9d0._M_pi;
    if (*(char *)&((__shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2> *)
                  &((_Base_ptr)(local_5c8._0_8_ + 0x40))->_M_color)->_M_ptr == '\x01') {
      NVar3 = ((*(pointer *)(paVar17->_M_local_buf + 0x38))[-1].
               super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              _type;
      if ((_Base_ptr)local_5c8._8_8_ != (_Base_ptr)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_5c8._8_8_);
        _Var25._M_pi = in_stack_fffffffffffff9d0._M_pi;
      }
      if (NVar3 != CNS) goto LAB_001a7470;
      local_618._0_8_ = (pointer)0x0;
      local_618._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      _Var18._M_p = (pointer)operator_new(0x48);
      express::ExpressNode::ExpressNode((ExpressNode *)_Var18._M_p);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<front::express::ExpressNode*>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xfffffffffffff9d0,
                 (ExpressNode *)_Var18._M_p);
      in_stack_fffffffffffff9c8._M_p = (pointer)0x0;
      in_stack_fffffffffffff9d0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_618._0_8_ = _Var18._M_p;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_618._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_618._8_8_);
        local_618._8_8_ = _Var25._M_pi;
        _Var25._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_618._8_8_;
      }
      local_618._8_8_ = _Var25._M_pi;
      if (in_stack_fffffffffffff9d0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (in_stack_fffffffffffff9d0._M_pi);
      }
      uVar12 = local_5c8._8_8_;
      *(size_type *)local_618._0_8_ = 0x400000000;
      if ((_Base_ptr)local_5c8._8_8_ != (_Base_ptr)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)(local_5c8._8_8_ + 8) = *(int *)(local_5c8._8_8_ + 8) + 1;
          UNLOCK();
        }
        else {
          *(int *)(local_5c8._8_8_ + 8) = *(int *)(local_5c8._8_8_ + 8) + 1;
        }
      }
      uVar16 = (ulong)*(int *)(*(long *)&((((*(pointer *)(paVar17->_M_local_buf + 0x38))[-1].
                                            super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_ptr)->_children).
                                          super__Vector_base<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->
                                         super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>
                              + 8);
      peVar11 = ((__shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2> *)
                &((_Base_ptr)(local_5c8._0_8_ + 0x60))->_M_color)->_M_ptr;
      if ((ulong)((long)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)(local_5c8._0_8_ + 0x68))->_M_allocated_capacity - (long)peVar11 >> 4)
          <= uVar16) {
        uVar23 = std::__throw_out_of_range_fmt
                           (
                           "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                           );
        if ((_Base_ptr)uVar12 != (_Base_ptr)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar12);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_618._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_618._8_8_);
        }
        if (_Var30._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var30._M_pi);
        }
        if (p_Var27 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var27);
        }
        if ((_Base_ptr)local_5c8._8_8_ != (_Base_ptr)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_5c8._8_8_);
        }
        if (local_580 != (_Base_ptr)local_570) {
          operator_delete(local_580,CONCAT71(local_570._1_7_,local_570[0]) + 1);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*(_Hash_node_base **)local_5b8._24_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     *(_Hash_node_base **)local_5b8._24_8_);
        }
        _Unwind_Resume(uVar23);
      }
      *(int *)(local_618._0_8_ + 8) = *(int *)((&peVar11->_vptr_Symbol)[uVar16 * 2] + 1);
      if ((_Base_ptr)local_5c8._8_8_ != (_Base_ptr)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_5c8._8_8_);
      }
      *(undefined8 *)this = local_618._0_8_;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_5b8._24_8_,
                 (__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_618 + 8));
      _Var25._M_pi = extraout_RDX_38;
      a_Stack_5e0[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_618._8_8_;
    }
    else {
      if ((_Base_ptr)local_5c8._8_8_ != (_Base_ptr)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_5c8._8_8_);
        _Var25._M_pi = in_stack_fffffffffffff9d0._M_pi;
      }
LAB_001a7470:
      local_5e8 = (ExpressNode *)0x0;
      a_Stack_5e0[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_618._0_8_ = local_618 + 0x10;
      local_618._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_618[0x10] = '\0';
      irGenerator::irGenerator::getNewTmpValueName_abi_cxx11_
                ((string *)&stack0xfffffffffffff9c8,&this_01->irGenerator,Int);
      std::__cxx11::string::operator=((string *)local_618,(string *)&stack0xfffffffffffff9c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)in_stack_fffffffffffff9c8._M_p != &local_628) {
        operator_delete(in_stack_fffffffffffff9c8._M_p,
                        CONCAT71(local_628._M_allocated_capacity._1_7_,local_628._M_local_buf[0]) +
                        1);
      }
      _Var18._M_p = (pointer)operator_new(0x48);
      express::ExpressNode::ExpressNode((ExpressNode *)_Var18._M_p);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<front::express::ExpressNode*>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xfffffffffffff9d0,
                 (ExpressNode *)_Var18._M_p);
      in_stack_fffffffffffff9c8._M_p = (pointer)0x0;
      in_stack_fffffffffffff9d0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_5e8 = (ExpressNode *)_Var18._M_p;
      if (a_Stack_5e0[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_5e0[0]._M_pi);
        a_Stack_5e0[0]._M_pi = _Var25._M_pi;
        _Var25._M_pi = a_Stack_5e0[0]._M_pi;
      }
      a_Stack_5e0[0]._M_pi = _Var25._M_pi;
      if (in_stack_fffffffffffff9d0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (in_stack_fffffffffffff9d0._M_pi);
      }
      local_5e8->_type = VAR;
      local_5e8->_operation = LOAD;
      std::__cxx11::string::_M_assign((string *)&local_5e8->_name);
      if (_Var30._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (_Var30._M_pi)->_M_use_count = (_Var30._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (_Var30._M_pi)->_M_use_count = (_Var30._M_pi)->_M_use_count + 1;
        }
      }
      local_540.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)paVar17;
      local_540.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = _Var30._M_pi;
      express::ExpressNode::addChild(local_5e8,&local_540);
      if (local_540.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_540.
                   super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      *(ExpressNode **)this = local_5e8;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_5b8._24_8_,a_Stack_5e0);
      local_170._0_8_ = (long)&local_170 + 0x10;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_170,local_618._0_8_,
                 (pointer)((long)(_func_int ***)local_618._8_8_ + local_618._0_8_));
      local_150 = 1;
      local_58._0_8_ = (long)&local_58 + 0x10;
      pcVar10 = (((string *)(paVar17->_M_local_buf + 0x10))->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_58,pcVar10,pcVar10 + *(size_type *)(paVar17->_M_local_buf + 0x18))
      ;
      local_38 = 2;
      irGenerator::irGenerator::ir_load
                (&this_01->irGenerator,(LeftVal *)&local_170._M_first,(RightVal *)&local_58._M_first
                );
      (*std::__detail::__variant::
        __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
        ::_S_vtable._M_arr[local_38]._M_data)
                ((anon_class_1_0_00000001 *)&stack0xfffffffffffff9c8,
                 (variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_58._M_first);
      local_38 = 0xff;
      (*std::__detail::__variant::
        __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
        ::_S_vtable._M_arr[local_150]._M_data)
                ((anon_class_1_0_00000001 *)&stack0xfffffffffffff9c8,
                 (variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_170._M_first);
      local_150 = 0xff;
      _Var25._M_pi = extraout_RDX_07;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_618._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(local_618 + 0x10)) {
        operator_delete((void *)local_618._0_8_,CONCAT71(local_618._17_7_,local_618[0x10]) + 1);
        _Var25._M_pi = extraout_RDX_08;
      }
    }
    if (a_Stack_5e0[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_5e0[0]._M_pi);
      _Var25._M_pi = extraout_RDX_09;
    }
  }
  if (local_5ec == 1) {
    local_3a0[0] = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_390;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_3a0,
               ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_5c8._0_8_ + 8))->_M_pi,
               (long)&((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_5c8._0_8_ + 8))->_M_pi->
                      _vptr__Sp_counted_base +
               (long)((__shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2> *)
                     &((string *)(local_5c8._0_8_ + 0x10))->_M_dataplus)->_M_ptr);
    name_03._M_string_length = (size_type)_Var30._M_pi;
    name_03._M_dataplus._M_p = (pointer)paVar17;
    name_03.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffff9c8._M_p;
    name_03.field_2._8_8_ = in_stack_fffffffffffff9d0._M_pi;
    irGenerator::irGenerator::getVarName
              (&local_2c0,&this_01->irGenerator,name_03,(uint32_t)local_3a0);
    cVar19 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<front::optimization::bmir_variable_table::VarArray>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<front::optimization::bmir_variable_table::VarArray>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<front::optimization::bmir_variable_table::VarArray>_>_>_>
             ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<front::optimization::bmir_variable_table::VarArray>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<front::optimization::bmir_variable_table::VarArray>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<front::optimization::bmir_variable_table::VarArray>_>_>_>
                     *)&this_01->bmirVariableTable,&local_2c0);
    _Var25._M_pi = extraout_RDX_10;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
      operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1);
      _Var25._M_pi = extraout_RDX_11;
    }
    if (local_3a0[0] !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_390) {
      operator_delete(local_3a0[0],(ulong)(local_390._0_8_ + 1));
      _Var25._M_pi = extraout_RDX_12;
    }
    this = (SyntaxAnalyze *)local_5d0._M_nxt;
    if ((_Rb_tree_header *)cVar19._M_node !=
        &(this_01->bmirVariableTable).name2VarArray._M_t._M_impl.super__Rb_tree_header) {
      local_3c0[0] = local_3b0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_3c0,
                 ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_5c8._0_8_ + 8))->_M_pi,
                 (long)&((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_5c8._0_8_ + 8))->_M_pi
                        ->_vptr__Sp_counted_base +
                 (long)((__shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2> *)
                       &((string *)(local_5c8._0_8_ + 0x10))->_M_dataplus)->_M_ptr);
      name_04._M_string_length = (size_type)_Var30._M_pi;
      name_04._M_dataplus._M_p = (pointer)paVar17;
      name_04.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffff9c8._M_p;
      name_04.field_2._8_8_ = in_stack_fffffffffffff9d0._M_pi;
      irGenerator::irGenerator::getVarName
                ((string *)local_2e0,&this_01->irGenerator,name_04,(uint32_t)local_3c0);
      pmVar20 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<front::optimization::bmir_variable_table::VarArray>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<front::optimization::bmir_variable_table::VarArray>_>_>_>
                ::at(&(this_01->bmirVariableTable).name2VarArray,(key_type *)local_2e0);
      ((pmVar20->
       super___shared_ptr<front::optimization::bmir_variable_table::VarArray,_(__gnu_cxx::_Lock_policy)2>
       )._M_ptr)->changed = true;
      _Var25._M_pi = extraout_RDX_13;
      if ((_Base_ptr)local_2e0._0_8_ != (_Base_ptr)(local_2e0 + 0x10)) {
        operator_delete((void *)local_2e0._0_8_,local_2e0._16_8_ + 1);
        _Var25._M_pi = extraout_RDX_14;
      }
      if (local_3c0[0] != local_3b0) {
        operator_delete(local_3c0[0],(ulong)((long)&local_3b0[0]->_beginLabel + 1));
        _Var25._M_pi = extraout_RDX_15;
      }
    }
  }
  if (_Var30._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var30._M_pi);
    _Var25._M_pi = extraout_RDX_16;
  }
  in_stack_fffffffffffff9c0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_5c8._8_8_;
  if (p_Var27 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var27);
    _Var25._M_pi = extraout_RDX_17;
    in_stack_fffffffffffff9c0._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_5c8._8_8_;
  }
LAB_001a834c:
  if ((_Base_ptr)in_stack_fffffffffffff9c0._M_pi != (_Base_ptr)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(in_stack_fffffffffffff9c0._M_pi);
    _Var25._M_pi = extraout_RDX_36;
  }
  if (local_580 != (_Base_ptr)local_570) {
    operator_delete(local_580,CONCAT71(local_570._1_7_,local_570[0]) + 1);
    _Var25._M_pi = extraout_RDX_37;
  }
  SVar28.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var25._M_pi;
  SVar28.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (SharedExNdPtr)
         SVar28.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

SharedExNdPtr SyntaxAnalyze::gm_l_val(ValueMode mode) {
  SharedExNdPtr node(new ExpressNode());
  string name;

  match_one_word(Token::IDENFR);
  name = get_least_matched_word().get_self();

  if (try_word(1, Token::LBRACK)) {
    SharedSyPtr arr = symbolTable.find_least_layer_symbol(name);
    SharedExNdPtr index;
    SharedExNdPtr child;
    SharedExNdPtr addr;
    node->_type = NodeType::VAR;
    node->_operation =
        (std::static_pointer_cast<ArraySymbol>(arr)->isParam() ||
                 (arr->getLayerNum() != _initLayerNum &&
                  !std::static_pointer_cast<ArraySymbol>(arr)->isConst())
             ? OperationType::PTR
             : OperationType::ARR);
    node->_name = (std::static_pointer_cast<ArraySymbol>(arr)->isConst()
                       ? irGenerator.getConstName(arr->getName(), arr->getId())
                       : irGenerator.getVarName(arr->getName(), arr->getId()));
    while (try_word(1, Token::LBRACK)) {
      match_one_word(Token::LBRACK);
      child = gm_exp();
      node->addChild(child);
      match_one_word(Token::RBRACK);
    }

    addr = computeIndex(arr, node);

    if (mode == ValueMode::left ||
        node->_children.size() <
            std::static_pointer_cast<ArraySymbol>(arr)->_dimensions.size()) {
      node = addr;
    } else if (std::static_pointer_cast<ArraySymbol>(arr)->isConst() &&
               addr->_children.back()->_type == NodeType::CNS) {
      SharedExNdPtr constValue;

      constValue = SharedExNdPtr(new ExpressNode());
      constValue->_type = NodeType::CNS;
      constValue->_operation = OperationType::NUMBER;
      constValue->_value =
          std::static_pointer_cast<ArraySymbol>(arr)
              ->_values.at(addr->_children.back()->_children.front()->_value)
              ->_value;
      node = constValue;
    } else {
      SharedExNdPtr loadValue;
      string value;

      value = irGenerator.getNewTmpValueName(TyKind::Int);
      loadValue = SharedExNdPtr(new ExpressNode());
      loadValue->_type = NodeType::VAR;
      loadValue->_operation = OperationType::LOAD;
      loadValue->_name = value;
      loadValue->addChild(addr);
      node = loadValue;

      irGenerator.ir_load(value, addr->_name);
    }

    if (mode == ValueMode::left) {
      if (bmirVariableTable.hasNameKey(
              irGenerator.getVarName(arr->getName(), arr->getId()))) {
        bmirVariableTable
            .getVarArray(irGenerator.getVarName(arr->getName(), arr->getId()))
            ->changed = true;
      }
    }
  } else {
    SharedSyPtr var = symbolTable.find_least_layer_symbol(name);

    if (var->kind() == SymbolKind::INT) {
      if (std::static_pointer_cast<IntSymbol>(var)->isConst()) {
        node->_type = NodeType::CNS;
        node->_operation = OperationType::VAR;
        node->_value = std::static_pointer_cast<IntSymbol>(var)->getValue();
      } else {
        node->_type = NodeType::VAR;
        node->_operation = OperationType::VAR;
        node->_name = irGenerator.getVarName(var->getName(), var->getId());
        if (var->getLayerNum() == _initLayerNum) {
          SharedExNdPtr addr;
          string addrTmp;

          addrTmp = irGenerator.getNewTmpValueName(TyKind::Ptr);
          addr = SharedExNdPtr(new ExpressNode());
          addr->_type = NodeType::VAR;
          addr->_operation = OperationType::PTR;
          addr->_name = addrTmp;
          addr->addChild(node);

          irGenerator.ir_ref(addrTmp, node->_name);

          if (mode == ValueMode::left) {
            node = addr;
          } else {
            SharedExNdPtr value;
            string valueTmp;

            valueTmp = irGenerator.getNewTmpValueName(TyKind::Int);
            value = SharedExNdPtr(new ExpressNode());
            value->_type = NodeType::VAR;
            value->_operation = OperationType::LOAD;
            value->_name = valueTmp;
            value->addChild(addr);

            irGenerator.ir_load(value->_name, addr->_name);
            node = value;
          }
        }

        if (mode == ValueMode::left) {
          if (bmirVariableTable.hasVarSingle(
                  irGenerator.getVarName(var->getName(), var->getId()))) {
            bmirVariableTable
                .getVarSingle(
                    irGenerator.getVarName(var->getName(), var->getId()))
                ->changed = true;
          }
        }
      }
    } else if (var->kind() == SymbolKind::Array) {
      string arrPtr;

      // The existing of arr name alone which must be the param to func
      arrPtr = irGenerator.getNewTmpValueName(TyKind::Ptr);
      node->_type = NodeType::VAR;
      node->_operation = OperationType::PTR;
      node->_name = arrPtr;

      if (std::static_pointer_cast<ArraySymbol>(var)->isConst()) {
        irGenerator.ir_ref(
            arrPtr, irGenerator.getConstName(var->getName(), var->getId()));
      } else if (std::static_pointer_cast<ArraySymbol>(var)->isParam()) {
        irGenerator.ir_assign(
            arrPtr, irGenerator.getVarName(var->getName(), var->getId()));
      } else if (var->getLayerNum() != _initLayerNum &&
                 !std::static_pointer_cast<ArraySymbol>(var)->isConst()) {
        irGenerator.ir_assign(
            arrPtr, irGenerator.getVarName(var->getName(), var->getId()));
      } else {
        irGenerator.ir_ref(
            arrPtr, irGenerator.getVarName(var->getName(), var->getId()));
      }

      if (bmirVariableTable.hasNameKey(
              irGenerator.getVarName(var->getName(), var->getId()))) {
        bmirVariableTable
            .getVarArray(irGenerator.getVarName(var->getName(), var->getId()))
            ->changed = true;
      }
    }
  }

  return node;
}